

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

void ssl_calc_verify_tls_sha384(mbedtls_ssl_context *ssl,uchar *hash)

{
  mbedtls_sha512_context sha512;
  mbedtls_sha512_context local_f0;
  
  mbedtls_sha512_init(&local_f0);
  mbedtls_sha512_clone(&local_f0,&ssl->handshake->fin_sha512);
  mbedtls_sha512_finish_ret(&local_f0,hash);
  mbedtls_sha512_free(&local_f0);
  return;
}

Assistant:

void ssl_calc_verify_tls_sha384( mbedtls_ssl_context *ssl, unsigned char hash[48] )
{
    mbedtls_sha512_context sha512;

    mbedtls_sha512_init( &sha512 );

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> calc verify sha384" ) );

    mbedtls_sha512_clone( &sha512, &ssl->handshake->fin_sha512 );
    mbedtls_sha512_finish_ret( &sha512, hash );

    MBEDTLS_SSL_DEBUG_BUF( 3, "calculated verify result", hash, 48 );
    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= calc verify" ) );

    mbedtls_sha512_free( &sha512 );

    return;
}